

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O2

void __thiscall
miniros::ServiceClientLink::onRequest
          (ServiceClientLink *this,ConnectionPtr *conn,shared_ptr<unsigned_char[]> *buffer,
          uint32_t size,bool success)

{
  undefined3 in_register_00000081;
  ServicePublicationPtr parent;
  ServiceClientLinkPtr local_50;
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (CONCAT31(in_register_00000081,success) != 0) {
    std::__shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,&this->parent_);
    if (local_30._M_ptr != (ServicePublication *)0x0) {
      std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&buffer->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)
      ;
      std::__shared_ptr<miniros::ServiceClientLink,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::ServiceClientLink,void>
                ((__shared_ptr<miniros::ServiceClientLink,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                 (__weak_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<miniros::ServiceClientLink>);
      ServicePublication::processRequest
                (local_30._M_ptr,(shared_ptr<unsigned_char[]> *)&local_40,(ulong)size,&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_50.
                  super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return;
}

Assistant:

void ServiceClientLink::onRequest(const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
{
  (void)conn;
  if (!success)
    return;

  MINIROS_ASSERT(conn == connection_);

  if (ServicePublicationPtr parent = parent_.lock())
  {
    parent->processRequest(buffer, size, shared_from_this());
  }
  else
  {
    MINIROS_BREAK();
  }
}